

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void __thiscall Fl_Widget_Type::ideal_size(Fl_Widget_Type *this,int *w,int *h)

{
  Fl_Fontsize FVar1;
  Fl_Boxtype FVar2;
  int iVar3;
  int *h_local;
  int *w_local;
  Fl_Widget_Type *this_local;
  
  FVar1 = Fl_Widget::labelsize(this->o);
  *h = FVar1;
  Fl_Widget::measure_label(this->o,w,h);
  FVar2 = Fl_Widget::box(this->o);
  iVar3 = Fl::box_dw(FVar2);
  *w = iVar3 + *w;
  FVar2 = Fl_Widget::box(this->o);
  iVar3 = Fl::box_dh(FVar2);
  *h = iVar3 + *h;
  if (*w < 0xf) {
    *w = 0xf;
  }
  if (*h < 0xf) {
    *h = 0xf;
  }
  return;
}

Assistant:

void
Fl_Widget_Type::ideal_size(int &w, int &h) {
  h = o->labelsize();
  o->measure_label(w, h);

  w += Fl::box_dw(o->box());
  h += Fl::box_dh(o->box());

  if (w < 15) w = 15;
  if (h < 15) h = 15;
}